

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayImageOperations.cpp
# Opt level: O0

void __thiscall
glcts::TextureCubeMapArrayImageOpCompute::initTest(TextureCubeMapArrayImageOpCompute *this)

{
  int iVar1;
  deUint32 dVar2;
  GLuint GVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  NotSupportedError *pNVar5;
  char *local_30;
  char *copy_cs_source;
  long local_18;
  Functions *gl;
  TextureCubeMapArrayImageOpCompute *this_local;
  
  gl = (Functions *)this;
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  local_18 = CONCAT44(extraout_var,iVar1);
  if (((this->super_TestCaseBase).m_is_texture_cube_map_array_supported & 1U) == 0) {
    pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar5,"Texture cube map array functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
               ,0x159);
    __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  if ((((this->super_TestCaseBase).m_is_geometry_shader_extension_supported & 1U) == 0) &&
     (this->m_shader_to_check == STC_GEOMETRY_SHADER)) {
    pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar5,"Geometry shader functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
               ,0x15d);
    __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  if ((((this->super_TestCaseBase).m_is_tessellation_shader_supported & 1U) == 0) &&
     ((this->m_shader_to_check == STC_TESSELLATION_CONTROL_SHADER ||
      (this->m_shader_to_check == STC_TESSELLATION_EVALUATION_SHADER)))) {
    pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar5,"Tessellation shader functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
               ,0x162);
    __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  (**(code **)(local_18 + 0x708))(1,&this->m_vao_id);
  dVar2 = (**(code **)(local_18 + 0x800))();
  glu::checkError(dVar2,"Could not generate vertex array object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                  ,0x167);
  (**(code **)(local_18 + 0xd8))(this->m_vao_id);
  dVar2 = (**(code **)(local_18 + 0x800))();
  glu::checkError(dVar2,"Error binding vertex array object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                  ,0x16a);
  (**(code **)(local_18 + 0x6d0))(1,&this->m_fbo_id);
  dVar2 = (**(code **)(local_18 + 0x800))();
  glu::checkError(dVar2,"Error generating frame buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                  ,0x16e);
  (**(code **)(local_18 + 0x78))(0x8ca8,this->m_fbo_id);
  dVar2 = (**(code **)(local_18 + 0x800))();
  glu::checkError(dVar2,"Error binding frame buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                  ,0x171);
  GVar3 = (**(code **)(local_18 + 0x3c8))();
  this->m_copy_po_id = GVar3;
  GVar3 = (**(code **)(local_18 + 0x3f0))(0x91b9);
  this->m_copy_cs_id = GVar3;
  local_30 = getFloatingPointCopyShaderSource(this);
  TestCaseBase::buildProgram
            (&this->super_TestCaseBase,this->m_copy_po_id,this->m_copy_cs_id,1,&local_30,(bool *)0x0
            );
  GVar3 = (**(code **)(local_18 + 0x3c8))();
  this->m_po_id = GVar3;
  dVar2 = (**(code **)(local_18 + 0x800))();
  glu::checkError(dVar2,"Error creating program object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                  ,0x17b);
  configureProgram(this);
  return;
}

Assistant:

void TextureCubeMapArrayImageOpCompute::initTest(void)
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Check if texture_cube_map_array extension is supported */
	if (!m_is_texture_cube_map_array_supported)
	{
		throw tcu::NotSupportedError(TEXTURE_CUBE_MAP_ARRAY_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}
	if (!m_is_geometry_shader_extension_supported && m_shader_to_check == STC_GEOMETRY_SHADER)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}
	if (!m_is_tessellation_shader_supported && (m_shader_to_check == STC_TESSELLATION_CONTROL_SHADER ||
												m_shader_to_check == STC_TESSELLATION_EVALUATION_SHADER))
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Generate and bind VAO */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate vertex array object");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding vertex array object!");

	/* Generate and bind framebuffer */
	gl.genFramebuffers(1, &m_fbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating frame buffer object!");

	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, m_fbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding frame buffer object!");

	/* Create the floating point copy program */
	m_copy_po_id			   = gl.createProgram();
	m_copy_cs_id			   = gl.createShader(GL_COMPUTE_SHADER);
	const char* copy_cs_source = getFloatingPointCopyShaderSource();
	buildProgram(m_copy_po_id, m_copy_cs_id, 1, &copy_cs_source);

	/* Create program */
	m_po_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating program object!");

	configureProgram();
}